

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::DMatrix(DMatrix *this)

{
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffffc0;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *this_00;
  allocator_type local_1d [29];
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  this_00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 3);
  std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>::allocator
            ((allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*> *)0x1c39e1);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::vector((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            *)this_00,(size_type)in_RDI,in_stack_ffffffffffffffc0);
  std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>::~allocator
            ((allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*> *)0x1c3a00);
  __a = local_1d;
  std::allocator<float>::allocator((allocator<float> *)0x1c3a1d);
  std::vector<float,_std::allocator<float>_>::vector(this_00,(size_type)in_RDI,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x1c3a3c);
  std::allocator<float>::allocator((allocator<float> *)0x1c3a58);
  std::vector<float,_std::allocator<float>_>::vector(this_00,(size_type)in_RDI,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x1c3a76);
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  return;
}

Assistant:

DMatrix()
   : hash_value_1(0), 
     hash_value_2(0),
     row_length(0),
     row(0),
     Y(0),
     norm(0),
     has_label(false),
     pos(0) { }